

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O2

Reals __thiscall Omega_h::measure_edges_metric(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *metrics)

{
  Alloc *pAVar1;
  LO nmetrics;
  uint uVar2;
  Int IVar3;
  ulong uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar5;
  Write<int> *this_00;
  Reals RVar6;
  allocator local_101;
  Write<double> local_100;
  Write<int> local_f0;
  Write<double> local_e0;
  Write<int> local_d0;
  Write<double> local_c0;
  Write<int> local_b0;
  Write<double> local_a0;
  Write<int> local_90;
  Write<double> local_80;
  Write<int> local_70;
  Write<double> local_60;
  string local_50;
  
  pAVar1 = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar4 = pAVar1->size;
  }
  else {
    uVar4 = (ulong)pAVar1 >> 3;
  }
  if ((int)(uVar4 >> 2) == 0) {
    std::__cxx11::string::string((string *)&local_50,"",&local_101);
    Read<double>::Read((Read<double> *)this,(initializer_list<double>)ZEXT816(0),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pvVar5 = extraout_RDX;
  }
  else {
    nmetrics = Mesh::nverts(mesh);
    Write<double>::Write(&local_60,&metrics->write_);
    uVar2 = get_metrics_dim(nmetrics,(Reals *)&local_60);
    Write<double>::~Write(&local_60);
    IVar3 = Mesh::dim(mesh);
    if (uVar2 == 3 && IVar3 == 3) {
      Write<int>::Write(&local_70,&a2e->write_);
      Write<double>::Write(&local_80,&metrics->write_);
      measure_edges_metric_tmpl<3,3>(this,mesh,(LOs *)&local_70,(Reals *)&local_80);
      Write<double>::~Write(&local_80);
      this_00 = &local_70;
    }
    else {
      IVar3 = Mesh::dim(mesh);
      if (uVar2 == 2 && IVar3 == 2) {
        Write<int>::Write(&local_90,&a2e->write_);
        Write<double>::Write(&local_a0,&metrics->write_);
        measure_edges_metric_tmpl<2,2>(this,mesh,(LOs *)&local_90,(Reals *)&local_a0);
        Write<double>::~Write(&local_a0);
        this_00 = &local_90;
      }
      else {
        IVar3 = Mesh::dim(mesh);
        if (IVar3 == 3 && (uVar2 ^ 1) == 0) {
          Write<int>::Write(&local_b0,&a2e->write_);
          Write<double>::Write(&local_c0,&metrics->write_);
          measure_edges_metric_tmpl<3,1>(this,mesh,(LOs *)&local_b0,(Reals *)&local_c0);
          Write<double>::~Write(&local_c0);
          this_00 = &local_b0;
        }
        else {
          IVar3 = Mesh::dim(mesh);
          if ((uVar2 ^ 1) == 0 && IVar3 == 2) {
            Write<int>::Write(&local_d0,&a2e->write_);
            Write<double>::Write(&local_e0,&metrics->write_);
            measure_edges_metric_tmpl<2,1>(this,mesh,(LOs *)&local_d0,(Reals *)&local_e0);
            Write<double>::~Write(&local_e0);
            this_00 = &local_d0;
          }
          else {
            IVar3 = Mesh::dim(mesh);
            if ((uVar2 != 1) || (IVar3 != 1)) {
              fail("assertion %s failed at %s +%d\n","false",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_shape.cpp"
                   ,0x24);
            }
            Write<int>::Write(&local_f0,&a2e->write_);
            Write<double>::Write(&local_100,&metrics->write_);
            measure_edges_metric_tmpl<1,1>(this,mesh,(LOs *)&local_f0,(Reals *)&local_100);
            Write<double>::~Write(&local_100);
            this_00 = &local_f0;
          }
        }
      }
    }
    Write<int>::~Write(this_00);
    pvVar5 = extraout_RDX_00;
  }
  RVar6.write_.shared_alloc_.direct_ptr = pvVar5;
  RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar6.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric(Mesh* mesh, LOs a2e, Reals metrics) {
  if (a2e.size() == 0) return Reals({});
  auto metric_dim = get_metrics_dim(mesh->nverts(), metrics);
  if (mesh->dim() == 3 && metric_dim == 3) {
    return measure_edges_metric_tmpl<3, 3>(mesh, a2e, metrics);
  } else if (mesh->dim() == 2 && metric_dim == 2) {
    return measure_edges_metric_tmpl<2, 2>(mesh, a2e, metrics);
  } else if (mesh->dim() == 3 && metric_dim == 1) {
    return measure_edges_metric_tmpl<3, 1>(mesh, a2e, metrics);
  } else if (mesh->dim() == 2 && metric_dim == 1) {
    return measure_edges_metric_tmpl<2, 1>(mesh, a2e, metrics);
  } else if (mesh->dim() == 1 && metric_dim == 1) {
    return measure_edges_metric_tmpl<1, 1>(mesh, a2e, metrics);
  }
  OMEGA_H_NORETURN(Reals());
}